

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

void __thiscall
helics::apps::App::processArgs
          (App *this,
          unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *app,
          FederateInfo *fedInfo,string_view defaultAppName)

{
  ParseOutput PVar1;
  element_type *peVar2;
  allocator<char> local_71;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string local_60;
  string local_40;
  
  local_70._M_str = defaultAppName._M_str;
  local_70._M_len = defaultAppName._M_len;
  CLI::App::remaining_for_passthrough_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_60,
             &((app->_M_t).
               super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
               .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl)->super_App,
             false);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->remArgs,&local_60);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_60);
  PVar1 = ((app->_M_t).
           super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
           .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl)->last_output;
  if (PVar1 == OK) {
    if (((this->inputFileName)._M_string_length == 0) && (this->fileLoaded == false)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"helics.json",&local_71);
      CLI::Validator::operator()(&local_60,(Validator *)CLI::ExistingFile,&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      if (local_60._M_string_length == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&this->inputFileName,"helics.json");
      }
    }
    if ((fedInfo->defName)._M_string_length == 0) {
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&fedInfo->defName,&local_70);
    }
    std::make_shared<helics::CombinationFederate,char_const(&)[1],helics::FederateInfo&>
              ((char (*) [1])&local_60,(FederateInfo *)0x35f754);
    CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->fed).
                super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
    peVar2 = (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->configFileName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (&(peVar2->super_ValueFederate).field_0x38 +
               (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
  }
  else {
    if (PVar1 == HELP_CALL) {
      this->helpMode = true;
    }
    this->deactivated = true;
  }
  return;
}

Assistant:

void App::processArgs(std::unique_ptr<helicsCLI11App>& app,
                      FederateInfo& fedInfo,
                      std::string_view defaultAppName)
{
    remArgs = app->remaining_for_passthrough();
    auto ret = app->last_output;
    if (ret == helicsCLI11App::ParseOutput::HELP_CALL) {
        helpMode = true;
    }
    if (ret != helicsCLI11App::ParseOutput::OK) {
        deactivated = true;
        return;
    }

    if (inputFileName.empty()) {
        if (!fileLoaded) {
            if (CLI::ExistingFile("helics.json").empty()) {
                inputFileName = "helics.json";
            }
        }
    }

    if (fedInfo.defName.empty()) {
        fedInfo.defName = defaultAppName;
    }

    fed = std::make_shared<CombinationFederate>("", fedInfo);
    configFileName = fed->getConfigFile();
}